

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

ssize_t __thiscall Socket::recv(Socket *this,int __fd,void *__buf,size_t __n,int __flags)

{
  ssize_t sVar1;
  int *piVar2;
  undefined4 in_register_00000034;
  usize received;
  ssize r;
  usize minSize_local;
  usize maxSize_local;
  byte *data_local;
  Socket *this_local;
  
  minSize_local._0_4_ = (int)__buf;
  this_local = (Socket *)
               ::recv(this->s,(void *)CONCAT44(in_register_00000034,__fd),(long)(int)minSize_local,0
                     );
  if (this_local == (Socket *)0xffffffffffffffff) {
    piVar2 = __errno_location();
    if ((*piVar2 == 0xb) || (piVar2 = __errno_location(), *piVar2 == 0xb)) {
      piVar2 = __errno_location();
      *piVar2 = 0;
    }
    this_local = (Socket *)0xffffffffffffffff;
  }
  else if (this_local == (Socket *)0x0) {
    this_local = (Socket *)0x0;
  }
  else {
    for (; this_local < __n; this_local = (Socket *)((long)&this_local->s + sVar1)) {
      sVar1 = ::recv(this->s,(void *)((long)CONCAT44(in_register_00000034,__fd) + (long)this_local),
                     (long)((int)minSize_local - (int)this_local),0);
      if (sVar1 == -1) {
        piVar2 = __errno_location();
        if ((*piVar2 != 0xb) && (piVar2 = __errno_location(), *piVar2 != 0xb)) {
          return -1;
        }
        piVar2 = __errno_location();
        *piVar2 = 0;
        return (ssize_t)this_local;
      }
      if (sVar1 == 0) {
        return 0;
      }
    }
  }
  return (ssize_t)this_local;
}

Assistant:

ssize Socket::recv(byte* data, usize maxSize, usize minSize)
{
  ssize r = ::recv(s, (char*)data, (int)maxSize, 0);
  switch(r)
  {
  case SOCKET_ERROR:
    if(ERRNO == EWOULDBLOCK 
#ifndef _WIN32
      || ERRNO == EAGAIN
#endif
      )
    {
      SET_ERRNO(0);
    }
    return -1;
  case 0:
    return 0;
  default:
    break;
  }
  if((usize)r >= minSize)
    return r;
  usize received = (usize)r;
  for(;;)
  {
    r = ::recv(s, (char*)data + received, (int)(maxSize - received), 0);
    switch(r)
    {
    case SOCKET_ERROR:
      if(ERRNO == EWOULDBLOCK 
  #ifndef _WIN32
        || ERRNO == EAGAIN
  #endif
        )
      {
        SET_ERRNO(0);
        return received;
      }
      return -1;
    case 0:
      return 0;
    default:
      break;
    }
    received += r;
    if(received >= minSize)
      return received;
  }
}